

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O0

void __thiscall Field::Field(Field *this,int from,int to,string *str)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string *str_local;
  int to_local;
  int from_local;
  Field *this_local;
  
  this->from = from;
  this->to = to;
  std::__cxx11::string::string((string *)&this->name);
  this->value = 0;
  this->match = true;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if (*pcVar2 == '1') {
      this->value = this->value * 2 + 1;
    }
    else if (*pcVar2 == '0') {
      this->value = this->value << 1;
    }
    else {
      this->match = false;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  if ((this->match & 1U) == 0) {
    this->value = 0;
    std::__cxx11::string::operator=((string *)&this->name,(string *)str);
    this->expand = to - from == 1;
  }
  else {
    this->expand = false;
  }
  return;
}

Assistant:

Field::Field(int from, int to, std::string str)
    : from(from), to(to)
{
    value = 0;
    match = true;
    
    for(char c : str)
    {
        if(c == '1')
            value = 2 * value + 1;
        else if(c == '0')
            value = 2 * value;
        else
            match = false;
    }
    if(!match)
    {
        value = 0;
        name = str;
        expand = (to - from == 1);
    }
    else
        expand = false;
}